

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O2

int MatrixEmbeddedLSSolve(SUNLinearSolver LS,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *user_data;
  sunrealtype cj;
  sunrealtype tcur;
  int retval;
  N_Vector res;
  N_Vector ypn;
  N_Vector yyn;
  N_Vector yppred;
  N_Vector yypred;
  
  retval = IDAGetNonlinearSystemData
                     (LS->content,&tcur,&yypred,&yppred,&yyn,&ypn,&res,&cj,&user_data);
  iVar3 = check_retval(&retval,"IDAGetNonlinearSystemData",1);
  if (iVar3 == 0) {
    dVar4 = tcur + 2.0;
    pdVar2 = *(double **)((long)b->content + 0x10);
    dVar1 = pdVar2[1];
    auVar5._8_8_ = -(((-cj - (*user_data + -1.0) / (tcur + -2.0)) + -1.0) * dVar1 - *pdVar2 * dVar4)
    ;
    auVar5._0_8_ = dVar1;
    auVar6._8_8_ = (*user_data + -1.0) * dVar4;
    auVar6._0_8_ = dVar4;
    auVar6 = divpd(auVar5,auVar6);
    **(undefined1 (**) [16])((long)x->content + 0x10) = auVar6;
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int MatrixEmbeddedLSSolve(SUNLinearSolver LS, SUNMatrix A, N_Vector x,
                                 N_Vector b, sunrealtype tol)
{
  /* temporary variables */
  int retval;
  N_Vector yypred, yppred, yyn, ypn, res;
  sunrealtype tcur, cj;
  void* user_data;
  sunrealtype* rdata;
  sunrealtype alpha;
  sunrealtype a11, a12, a21, b1, b2;
  sunrealtype ONE = SUN_RCONST(1.0);
  sunrealtype TWO = SUN_RCONST(2.0);

  /* retrieve implicit system data from IDA */
  retval = IDAGetNonlinearSystemData(LS->content, &tcur, &yypred, &yppred, &yyn,
                                     &ypn, &res, &cj, &user_data);
  if (check_retval((void*)&retval, "IDAGetNonlinearSystemData", 1))
  {
    return (-1);
  }

  /* extract stiffness parameter from user_data */
  rdata = (sunrealtype*)user_data;
  alpha = rdata[0];

  /* perform linear solve: A*x=b
         A = df/dy + cj*df/dyp
      =>
         A = [ - cj - (alpha - 1)/(t - 2) - 1, alpha - 1]
             [                          t + 2,         0]

   */
  a11            = -cj - (alpha - ONE) / (tcur - TWO) - ONE;
  a12            = alpha - ONE;
  a21            = tcur + TWO;
  b1             = NV_Ith_S(b, 0);
  b2             = NV_Ith_S(b, 1);
  NV_Ith_S(x, 0) = b2 / a21;
  NV_Ith_S(x, 1) = -(a11 * b2 - a21 * b1) / (a12 * a21);

  /* return with success */
  return (SUN_SUCCESS);
}